

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckDoubleMultipleOf
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,double d)

{
  bool bVar1;
  ValueType *this_00;
  Ch *pCVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble
                    (&this->multipleOf_);
  dVar5 = ABS(d / dVar3);
  dVar3 = floor(dVar5 + 0.5);
  dVar4 = ABS(dVar3 - dVar5);
  bVar1 = dVar4 <= (dVar5 + dVar3) * 2.220446049250313e-16;
  if (dVar4 >= 2.2250738585072014e-308 && !bVar1) {
    (*context->error_handler->_vptr_IValidationErrorHandler[4])
              (d,context->error_handler,&this->multipleOf_);
    context->invalidCode = kValidateErrorMultipleOf;
    this_00 = GetMultipleOfString();
    pCVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
    context->invalidKeyword = pCVar2;
  }
  return dVar4 < 2.2250738585072014e-308 || bVar1;
}

Assistant:

bool CheckDoubleMultipleOf(Context& context, double d) const {
        double a = std::abs(d), b = std::abs(multipleOf_.GetDouble());
        double q = a / b;
        double qRounded = std::floor(q + 0.5);
        double scaledEpsilon = (q + qRounded) * std::numeric_limits<double>::epsilon();
        double difference = std::abs(qRounded - q);
        bool isMultiple = difference <= scaledEpsilon || difference < (std::numeric_limits<double>::min)();
        if (!isMultiple) {
            context.error_handler.NotMultipleOf(d, multipleOf_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMultipleOf);
        }
        return true;
    }